

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_device_buffer.cpp
# Opt level: O1

void __thiscall
gpu::shared_device_buffer::shared_device_buffer
          (shared_device_buffer *this,shared_device_buffer *other,size_t offset)

{
  long *plVar1;
  
  plVar1 = (long *)other->buffer_;
  this->buffer_ = (uchar *)plVar1;
  this->data_ = other->data_;
  this->type_ = other->type_;
  this->size_ = other->size_;
  this->offset_ = offset + other->offset_;
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + 1;
    UNLOCK();
  }
  return;
}

Assistant:

shared_device_buffer::shared_device_buffer(const shared_device_buffer &other, size_t offset)
{
	buffer_	= other.buffer_;
	data_	= other.data_;
	type_	= other.type_;
	size_	= other.size_;
	offset_	= other.offset_ + offset;
	incref();
}